

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jsmn.c
# Opt level: O0

int jsmn_parse(jsmn_parser *parser,char *js,size_t len,jsmntok_t *tokens,uint num_tokens)

{
  char cVar1;
  int iVar2;
  jsmntype_t jVar3;
  jsmntok_t *in_RCX;
  char *in_RDX;
  jsmn_parser *in_RSI;
  jsmn_parser *in_RDI;
  uint in_R8D;
  bool bVar4;
  jsmntype_t type;
  char c;
  int count;
  jsmntok_t *token;
  int i;
  int r;
  undefined4 in_stack_ffffffffffffffb8;
  jsmntok_t *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  uint uVar5;
  int in_stack_ffffffffffffffd0;
  uint local_4;
  
  local_4 = in_RDI->toknext;
  do {
    bVar4 = false;
    if ((char *)(ulong)in_RDI->pos < in_RDX) {
      bVar4 = *(char *)((long)&in_RSI->pos + (ulong)in_RDI->pos) != '\0';
    }
    if (!bVar4) {
      if (in_RCX != (jsmntok_t *)0x0) {
        uVar5 = in_RDI->toknext;
        do {
          uVar5 = uVar5 - 1;
          if ((int)uVar5 < 0) {
            return local_4;
          }
        } while ((in_RCX[(int)uVar5].start == -1) || (in_RCX[(int)uVar5].end != -1));
        local_4 = 0xfffffffd;
      }
      return local_4;
    }
    cVar1 = *(char *)((long)&in_RSI->pos + (ulong)in_RDI->pos);
    in_stack_ffffffffffffffb8 = CONCAT13(cVar1,(int3)in_stack_ffffffffffffffb8);
    iVar2 = (int)cVar1;
    if (((1 < iVar2 - 9U) && (iVar2 != 0xd)) && (iVar2 != 0x20)) {
      if (iVar2 == 0x22) {
        in_stack_ffffffffffffffd0 =
             jsmn_parse_string(in_RSI,in_RDX,(size_t)in_RCX,
                               (jsmntok_t *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0),
                               CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
        if (in_stack_ffffffffffffffd0 < 0) {
          return in_stack_ffffffffffffffd0;
        }
        local_4 = local_4 + 1;
        if ((in_RDI->toksuper != -1) && (in_RCX != (jsmntok_t *)0x0)) {
          in_RCX[in_RDI->toksuper].size = in_RCX[in_RDI->toksuper].size + 1;
        }
      }
      else if (iVar2 == 0x2c) {
        if (((in_RCX != (jsmntok_t *)0x0) && (in_RDI->toksuper != -1)) &&
           ((in_RCX[in_RDI->toksuper].type != JSMN_ARRAY &&
            (in_RCX[in_RDI->toksuper].type != JSMN_OBJECT)))) {
          in_stack_ffffffffffffffcc = in_RDI->toknext;
          do {
            in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc - 1;
            if ((int)in_stack_ffffffffffffffcc < 0) goto LAB_00107f97;
          } while ((((in_RCX[(int)in_stack_ffffffffffffffcc].type != JSMN_ARRAY) &&
                    (in_RCX[(int)in_stack_ffffffffffffffcc].type != JSMN_OBJECT)) ||
                   (in_RCX[(int)in_stack_ffffffffffffffcc].start == -1)) ||
                  (in_RCX[(int)in_stack_ffffffffffffffcc].end != -1));
          in_RDI->toksuper = in_stack_ffffffffffffffcc;
        }
      }
      else if (iVar2 == 0x3a) {
        in_RDI->toksuper = in_RDI->toknext - 1;
      }
      else if (iVar2 == 0x5b) {
LAB_00107bd2:
        local_4 = local_4 + 1;
        if (in_RCX != (jsmntok_t *)0x0) {
          in_stack_ffffffffffffffc0 = jsmn_alloc_token(in_RDI,in_RCX,(ulong)in_R8D);
          if (in_stack_ffffffffffffffc0 == (jsmntok_t *)0x0) {
            return -1;
          }
          if (in_RDI->toksuper != -1) {
            in_RCX[in_RDI->toksuper].size = in_RCX[in_RDI->toksuper].size + 1;
          }
          jVar3 = JSMN_ARRAY;
          if ((char)((uint)in_stack_ffffffffffffffb8 >> 0x18) == '{') {
            jVar3 = JSMN_OBJECT;
          }
          in_stack_ffffffffffffffc0->type = jVar3;
          in_stack_ffffffffffffffc0->start = in_RDI->pos;
          in_RDI->toksuper = in_RDI->toknext - 1;
        }
      }
      else {
        if (iVar2 != 0x5d) {
          if (iVar2 == 0x7b) goto LAB_00107bd2;
          if (iVar2 != 0x7d) {
            in_stack_ffffffffffffffd0 =
                 jsmn_parse_primitive
                           ((jsmn_parser *)in_RCX,(char *)CONCAT44(in_R8D,in_stack_ffffffffffffffd0)
                            ,CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                            in_stack_ffffffffffffffc0,CONCAT44(local_4,in_stack_ffffffffffffffb8));
            if (in_stack_ffffffffffffffd0 < 0) {
              return in_stack_ffffffffffffffd0;
            }
            local_4 = local_4 + 1;
            if ((in_RDI->toksuper != -1) && (in_RCX != (jsmntok_t *)0x0)) {
              in_RCX[in_RDI->toksuper].size = in_RCX[in_RDI->toksuper].size + 1;
            }
            goto LAB_00107f97;
          }
        }
        if (in_RCX != (jsmntok_t *)0x0) {
          jVar3 = JSMN_ARRAY;
          if (cVar1 == '}') {
            jVar3 = JSMN_OBJECT;
          }
          in_stack_ffffffffffffffcc = in_RDI->toknext;
          do {
            in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc - 1;
            if ((int)in_stack_ffffffffffffffcc < 0) goto LAB_00107d36;
            in_stack_ffffffffffffffc0 = in_RCX + (int)in_stack_ffffffffffffffcc;
          } while ((in_stack_ffffffffffffffc0->start == -1) ||
                  (in_stack_ffffffffffffffc0->end != -1));
          if (in_stack_ffffffffffffffc0->type != jVar3) {
            return -2;
          }
          in_RDI->toksuper = -1;
          in_stack_ffffffffffffffc0->end = in_RDI->pos + 1;
LAB_00107d36:
          if (in_stack_ffffffffffffffcc == 0xffffffff) {
            return -2;
          }
          for (; -1 < (int)in_stack_ffffffffffffffcc;
              in_stack_ffffffffffffffcc = in_stack_ffffffffffffffcc - 1) {
            in_stack_ffffffffffffffc0 = in_RCX + (int)in_stack_ffffffffffffffcc;
            if ((in_stack_ffffffffffffffc0->start != -1) && (in_stack_ffffffffffffffc0->end == -1))
            {
              in_RDI->toksuper = in_stack_ffffffffffffffcc;
              break;
            }
          }
        }
      }
    }
LAB_00107f97:
    in_RDI->pos = in_RDI->pos + 1;
  } while( true );
}

Assistant:

int jsmn_parse(jsmn_parser *parser, const char *js, size_t len,
		jsmntok_t *tokens, unsigned int num_tokens) {
	int r;
	int i;
	jsmntok_t *token;
	int count = parser->toknext;

	for (; parser->pos < len && js[parser->pos] != '\0'; parser->pos++) {
		char c;
		jsmntype_t type;

		c = js[parser->pos];
		switch (c) {
			case '{': case '[':
				count++;
				if (tokens == NULL) {
					break;
				}
				token = jsmn_alloc_token(parser, tokens, num_tokens);
				if (token == NULL)
					return JSMN_ERROR_NOMEM;
				if (parser->toksuper != -1) {
					tokens[parser->toksuper].size++;
#ifdef JSMN_PARENT_LINKS
					token->parent = parser->toksuper;
#endif
				}
				token->type = (c == '{' ? JSMN_OBJECT : JSMN_ARRAY);
				token->start = parser->pos;
				parser->toksuper = parser->toknext - 1;
				break;
			case '}': case ']':
				if (tokens == NULL)
					break;
				type = (c == '}' ? JSMN_OBJECT : JSMN_ARRAY);
#ifdef JSMN_PARENT_LINKS
				if (parser->toknext < 1) {
					return JSMN_ERROR_INVAL;
				}
				token = &tokens[parser->toknext - 1];
				for (;;) {
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						token->end = parser->pos + 1;
						parser->toksuper = token->parent;
						break;
					}
					if (token->parent == -1) {
						break;
					}
					token = &tokens[token->parent];
				}
#else
				for (i = parser->toknext - 1; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						if (token->type != type) {
							return JSMN_ERROR_INVAL;
						}
						parser->toksuper = -1;
						token->end = parser->pos + 1;
						break;
					}
				}
				/* Error if unmatched closing bracket */
				if (i == -1) return JSMN_ERROR_INVAL;
				for (; i >= 0; i--) {
					token = &tokens[i];
					if (token->start != -1 && token->end == -1) {
						parser->toksuper = i;
						break;
					}
				}
#endif
				break;
			case '\"':
				r = jsmn_parse_string(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;
			case '\t' : case '\r' : case '\n' : case ' ':
				break;
			case ':':
				parser->toksuper = parser->toknext - 1;
				break;
			case ',':
				if (tokens != NULL && parser->toksuper != -1 &&
						tokens[parser->toksuper].type != JSMN_ARRAY &&
						tokens[parser->toksuper].type != JSMN_OBJECT) {
#ifdef JSMN_PARENT_LINKS
					parser->toksuper = tokens[parser->toksuper].parent;
#else
					for (i = parser->toknext - 1; i >= 0; i--) {
						if (tokens[i].type == JSMN_ARRAY || tokens[i].type == JSMN_OBJECT) {
							if (tokens[i].start != -1 && tokens[i].end == -1) {
								parser->toksuper = i;
								break;
							}
						}
					}
#endif
				}
				break;
#ifdef JSMN_STRICT
			/* In strict mode primitives are: numbers and booleans */
			case '-': case '0': case '1' : case '2': case '3' : case '4':
			case '5': case '6': case '7' : case '8': case '9':
			case 't': case 'f': case 'n' :
				/* And they must not be keys of the object */
				if (tokens != NULL && parser->toksuper != -1) {
					jsmntok_t *t = &tokens[parser->toksuper];
					if (t->type == JSMN_OBJECT ||
							(t->type == JSMN_STRING && t->size != 0)) {
						return JSMN_ERROR_INVAL;
					}
				}
#else
			/* In non-strict mode every unquoted value is a primitive */
			default:
#endif
				r = jsmn_parse_primitive(parser, js, len, tokens, num_tokens);
				if (r < 0) return r;
				count++;
				if (parser->toksuper != -1 && tokens != NULL)
					tokens[parser->toksuper].size++;
				break;

#ifdef JSMN_STRICT
			/* Unexpected char in strict mode */
			default:
				return JSMN_ERROR_INVAL;
#endif
		}
	}

	if (tokens != NULL) {
		for (i = parser->toknext - 1; i >= 0; i--) {
			/* Unmatched opened object or array */
			if (tokens[i].start != -1 && tokens[i].end == -1) {
				return JSMN_ERROR_PART;
			}
		}
	}

	return count;
}